

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O3

void __thiscall FileBuffer::loadSegment(FileBuffer *this,int segment,int loadToPosition)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  ifstream *this_00;
  ulong uVar6;
  
  iVar1 = this->_fileSegmentLength;
  iVar4 = -1;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  pvVar5 = operator_new__((long)iVar4);
  this_00 = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this_00);
  std::ifstream::open((char *)this_00,(_Ios_Openmode)this->_file);
  std::istream::seekg((long)this_00,iVar1 * segment);
  std::istream::read((char *)this_00,(long)pvVar5);
  uVar2 = *(undefined8 *)(this_00 + 8);
  std::ifstream::close();
  iVar1 = this->_fileSegmentLength;
  if (0 < (int)(uint)uVar2 && 0 < iVar1) {
    uVar6 = 1;
    do {
      this->_buffer[(uVar6 - 1) + (long)(iVar1 * loadToPosition)] =
           *(char *)((long)pvVar5 + (uVar6 - 1));
      if (((uint)uVar2 & 0x7fffffff) <= uVar6) break;
      bVar3 = (long)uVar6 < (long)this->_fileSegmentLength;
      uVar6 = uVar6 + 1;
    } while (bVar3);
  }
  this->_loadedSegments[loadToPosition] = segment;
  operator_delete__(pvVar5);
  return;
}

Assistant:

void FileBuffer::loadSegment(int segment, int loadToPosition) {
    //printf("Loading segment %d to position %d\n", segment, loadToPosition);
    //char **actualPosition = (char **) (&_buffer + (_fileSegmentLength * loadToPosition));



    int fileSegmentStartPos = segment * _fileSegmentLength;
    char *innerBuffer = new char[_fileSegmentLength];

    ifstream *fileStream = new ifstream();
    fileStream->open(_file);
    fileStream->seekg(fileSegmentStartPos, ios::beg);
    fileStream->read(innerBuffer, _fileSegmentLength);
    int readChars = (int) fileStream->gcount();
    fileStream->close();

    int bufferIndexStart = _fileSegmentLength * loadToPosition;

    for (int i = 0; i < _fileSegmentLength && i < readChars; i++) {
        _buffer[bufferIndexStart + i] = innerBuffer[i];
    }

    _loadedSegments[loadToPosition] = segment;

    delete[] innerBuffer;
}